

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

Vector6 * iDynTree::convertBodyFixedAccelerationToMixedAcceleration
                    (SpatialAcc *bodyFixedAcc,Twist *bodyFixedVel,Rotation *inertial_R_body)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Vector6 *in_RDI;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar10 = (*(double *)(bodyFixedVel + 0x18) * *(double *)(bodyFixedVel + 8) -
           *(double *)bodyFixedVel * *(double *)(bodyFixedVel + 0x20)) +
           (bodyFixedAcc->super_SpatialMotionVector).
           super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2];
  dVar11 = (bodyFixedAcc->super_SpatialMotionVector).
           super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] +
           (*(double *)(bodyFixedVel + 0x10) * *(double *)(bodyFixedVel + 0x20) -
           *(double *)(bodyFixedVel + 0x28) * *(double *)(bodyFixedVel + 8));
  dVar12 = (bodyFixedAcc->super_SpatialMotionVector).
           super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] +
           (*(double *)bodyFixedVel * *(double *)(bodyFixedVel + 0x28) -
           *(double *)(bodyFixedVel + 0x18) * *(double *)(bodyFixedVel + 0x10));
  dVar3 = *(double *)inertial_R_body;
  dVar4 = *(double *)(inertial_R_body + 8);
  dVar5 = *(double *)(inertial_R_body + 0x10);
  dVar6 = *(double *)(inertial_R_body + 0x18);
  dVar7 = *(double *)(inertial_R_body + 0x20);
  dVar8 = *(double *)(inertial_R_body + 0x30);
  dVar9 = *(double *)(inertial_R_body + 0x38);
  dVar1 = *(double *)(inertial_R_body + 0x28);
  dVar2 = *(double *)(inertial_R_body + 0x40);
  in_RDI->m_data[0] = dVar10 * dVar5 + dVar4 * dVar12 + dVar3 * dVar11;
  in_RDI->m_data[1] = dVar10 * dVar1 + dVar12 * dVar7 + dVar11 * dVar6;
  in_RDI->m_data[2] = dVar10 * dVar2 + dVar12 * dVar9 + dVar11 * dVar8;
  dVar11 = (bodyFixedAcc->super_SpatialMotionVector).
           super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0];
  dVar12 = (bodyFixedAcc->super_SpatialMotionVector).
           super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1];
  dVar10 = (bodyFixedAcc->super_SpatialMotionVector).
           super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2];
  in_RDI->m_data[3] = dVar10 * dVar5 + dVar4 * dVar12 + dVar3 * dVar11;
  in_RDI->m_data[4] = dVar10 * dVar1 + dVar7 * dVar12 + dVar6 * dVar11;
  in_RDI->m_data[5] = dVar9 * dVar12 + dVar8 * dVar11 + dVar2 * dVar10;
  return in_RDI;
}

Assistant:

Vector6 convertBodyFixedAccelerationToMixedAcceleration(const SpatialAcc & bodyFixedAcc,
                                                        const Twist & bodyFixedVel,
                                                        const Rotation & inertial_R_body)
{
    Vector6 mixedAcceleration;

    Eigen::Map<const Eigen::Vector3d> linBodyFixedAcc(bodyFixedAcc.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angBodyFixedAcc(bodyFixedAcc.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> linBodyFixedTwist(bodyFixedVel.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angBodyFixedTwist(bodyFixedVel.getAngularVec3().data());

    Eigen::Map<Eigen::Vector3d> linMixedAcc(mixedAcceleration.data());
    Eigen::Map<Eigen::Vector3d> angMixedAcc(mixedAcceleration.data()+3);

    Eigen::Map<const Matrix3dRowMajor> inertial_R_body_eig(inertial_R_body.data());

    // First we account for the effect of linear/angular velocity
    linMixedAcc = inertial_R_body_eig*(linBodyFixedAcc + angBodyFixedTwist.cross(linBodyFixedTwist));

    // Angular acceleration can be copied
    angMixedAcc = inertial_R_body_eig*angBodyFixedAcc;

    return mixedAcceleration;
}